

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O2

int __thiscall webrtc::EchoCancellationImpl::GetMetrics(EchoCancellationImpl *this,Metrics *metrics)

{
  int iVar1;
  CritScope cs;
  AecMetrics my_metrics;
  
  rtc::CritScope::CritScope(&cs,this->crit_capture_);
  if (metrics == (Metrics *)0x0) {
    iVar1 = -5;
  }
  else {
    iVar1 = -0xc;
    if ((this->enabled_ == true) && (this->metrics_enabled_ == true)) {
      my_metrics.aNlp.instant = 0;
      my_metrics.aNlp.average = 0;
      my_metrics.aNlp.max = 0;
      my_metrics.aNlp.min = 0;
      my_metrics.erle.instant = 0;
      my_metrics.erle.average = 0;
      my_metrics.erle.max = 0;
      my_metrics.erle.min = 0;
      my_metrics.divergent_filter_fraction = 0.0;
      my_metrics.erl.instant = 0;
      my_metrics.erl.average = 0;
      my_metrics.erl.max = 0;
      my_metrics.erl.min = 0;
      my_metrics.rerl.instant = 0;
      my_metrics.rerl.average = 0;
      my_metrics.rerl.max = 0;
      my_metrics.rerl.min = 0;
      (metrics->a_nlp).instant = 0;
      (metrics->a_nlp).average = 0;
      (metrics->a_nlp).maximum = 0;
      (metrics->a_nlp).minimum = 0;
      (metrics->echo_return_loss_enhancement).instant = 0;
      (metrics->echo_return_loss_enhancement).average = 0;
      (metrics->echo_return_loss_enhancement).maximum = 0;
      (metrics->echo_return_loss_enhancement).minimum = 0;
      (metrics->echo_return_loss).instant = 0;
      (metrics->echo_return_loss).average = 0;
      (metrics->echo_return_loss).maximum = 0;
      (metrics->echo_return_loss).minimum = 0;
      metrics->divergent_filter_fraction = 0.0;
      (metrics->residual_echo_return_loss).instant = 0;
      (metrics->residual_echo_return_loss).average = 0;
      (metrics->residual_echo_return_loss).maximum = 0;
      (metrics->residual_echo_return_loss).minimum = 0;
      iVar1 = WebRtcAec_GetMetrics
                        (*(void **)(((this->cancellers_).
                                     super__Vector_base<std::unique_ptr<webrtc::EchoCancellationImpl::Canceller,_std::default_delete<webrtc::EchoCancellationImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoCancellationImpl::Canceller,_std::default_delete<webrtc::EchoCancellationImpl::Canceller>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<webrtc::EchoCancellationImpl::Canceller,_std::default_delete<webrtc::EchoCancellationImpl::Canceller>_>
                                   ._M_t,&my_metrics);
      if (iVar1 == 0) {
        (metrics->residual_echo_return_loss).instant = my_metrics.rerl.instant;
        (metrics->residual_echo_return_loss).average = my_metrics.rerl.average;
        (metrics->residual_echo_return_loss).maximum = my_metrics.rerl.max;
        (metrics->residual_echo_return_loss).minimum = my_metrics.rerl.min;
        (metrics->echo_return_loss).instant = my_metrics.erl.instant;
        (metrics->echo_return_loss).average = my_metrics.erl.average;
        (metrics->echo_return_loss).maximum = my_metrics.erl.max;
        (metrics->echo_return_loss).minimum = my_metrics.erl.min;
        (metrics->echo_return_loss_enhancement).instant = my_metrics.erle.instant;
        (metrics->echo_return_loss_enhancement).average = my_metrics.erle.average;
        (metrics->echo_return_loss_enhancement).maximum = my_metrics.erle.max;
        (metrics->echo_return_loss_enhancement).minimum = my_metrics.erle.min;
        (metrics->a_nlp).instant = my_metrics.aNlp.instant;
        (metrics->a_nlp).average = my_metrics.aNlp.average;
        (metrics->a_nlp).maximum = my_metrics.aNlp.max;
        (metrics->a_nlp).minimum = my_metrics.aNlp.min;
        metrics->divergent_filter_fraction = my_metrics.divergent_filter_fraction;
        iVar1 = 0;
      }
      else if (iVar1 == 0x2ee1) {
        iVar1 = -4;
      }
      else if (iVar1 == 0x2f12) {
        iVar1 = -0xd;
      }
      else if (iVar1 == 0x2ee4) {
        iVar1 = -6;
      }
      else {
        iVar1 = -1;
      }
    }
  }
  rtc::CritScope::~CritScope(&cs);
  return iVar1;
}

Assistant:

int EchoCancellationImpl::GetMetrics(Metrics* metrics) {
  rtc::CritScope cs(crit_capture_);
  if (metrics == NULL) {
    return AudioProcessing::kNullPointerError;
  }

  if (!enabled_ || !metrics_enabled_) {
    return AudioProcessing::kNotEnabledError;
  }

  AecMetrics my_metrics;
  memset(&my_metrics, 0, sizeof(my_metrics));
  memset(metrics, 0, sizeof(Metrics));

  const int err = WebRtcAec_GetMetrics(cancellers_[0]->state(), &my_metrics);
  if (err != AudioProcessing::kNoError) {
    return MapError(err);
  }

  metrics->residual_echo_return_loss.instant = my_metrics.rerl.instant;
  metrics->residual_echo_return_loss.average = my_metrics.rerl.average;
  metrics->residual_echo_return_loss.maximum = my_metrics.rerl.max;
  metrics->residual_echo_return_loss.minimum = my_metrics.rerl.min;

  metrics->echo_return_loss.instant = my_metrics.erl.instant;
  metrics->echo_return_loss.average = my_metrics.erl.average;
  metrics->echo_return_loss.maximum = my_metrics.erl.max;
  metrics->echo_return_loss.minimum = my_metrics.erl.min;

  metrics->echo_return_loss_enhancement.instant = my_metrics.erle.instant;
  metrics->echo_return_loss_enhancement.average = my_metrics.erle.average;
  metrics->echo_return_loss_enhancement.maximum = my_metrics.erle.max;
  metrics->echo_return_loss_enhancement.minimum = my_metrics.erle.min;

  metrics->a_nlp.instant = my_metrics.aNlp.instant;
  metrics->a_nlp.average = my_metrics.aNlp.average;
  metrics->a_nlp.maximum = my_metrics.aNlp.max;
  metrics->a_nlp.minimum = my_metrics.aNlp.min;

  metrics->divergent_filter_fraction = my_metrics.divergent_filter_fraction;
  return AudioProcessing::kNoError;
}